

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-shutdown-after-write.c
# Opt level: O3

int run_test_tcp_shutdown_after_write(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_loop_t *puVar2;
  int *piVar3;
  undefined8 *extraout_RDX;
  int iVar4;
  uv_timer_t *puVar5;
  uv_connect_t *puVar6;
  uv_write_t *puVar7;
  uv_shutdown_t *puVar8;
  uv_tcp_t *puVar9;
  sockaddr_in addr;
  uv_buf_t uStack_28;
  sockaddr_in sStack_18;
  
  puVar5 = (uv_timer_t *)0x1a4b3a;
  uStack_28.len = 0x171369;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_18);
  if (iVar1 == 0) {
    uStack_28.len = 0x171376;
    puVar2 = uv_default_loop();
    uStack_28.len = 0x171388;
    puVar5 = (uv_timer_t *)puVar2;
    iVar1 = uv_timer_init(puVar2,&timer);
    if (iVar1 != 0) goto LAB_0017146e;
    puVar5 = &timer;
    uStack_28.len = 0x1713aa;
    iVar1 = uv_timer_start(&timer,timer_cb,0x7d,0);
    if (iVar1 != 0) goto LAB_00171473;
    uStack_28.len = 0x1713c1;
    puVar5 = (uv_timer_t *)puVar2;
    iVar1 = uv_tcp_init(puVar2,&conn);
    if (iVar1 != 0) goto LAB_00171478;
    puVar6 = &connect_req;
    uStack_28.len = 0x1713e6;
    iVar1 = uv_tcp_connect(&connect_req,&conn,(sockaddr *)&sStack_18,connect_cb);
    puVar5 = (uv_timer_t *)puVar6;
    if (iVar1 != 0) goto LAB_0017147d;
    uStack_28.len = 0x1713f8;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00171482;
    if (connect_cb_called != 1) goto LAB_00171487;
    if (write_cb_called != 1) goto LAB_0017148c;
    if (shutdown_cb_called != 1) goto LAB_00171491;
    if (conn_close_cb_called != 1) goto LAB_00171496;
    if (timer_close_cb_called == 1) {
      uStack_28.len = 0x171432;
      puVar2 = uv_default_loop();
      uStack_28.len = 0x171446;
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uStack_28.len = 0x171450;
      uv_run(puVar2,UV_RUN_DEFAULT);
      uStack_28.len = 0x171455;
      puVar2 = uv_default_loop();
      uStack_28.len = 0x17145d;
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001714a0;
    }
  }
  else {
    uStack_28.len = 0x17146e;
    run_test_tcp_shutdown_after_write_cold_1();
LAB_0017146e:
    uStack_28.len = 0x171473;
    run_test_tcp_shutdown_after_write_cold_2();
LAB_00171473:
    uStack_28.len = 0x171478;
    run_test_tcp_shutdown_after_write_cold_3();
LAB_00171478:
    uStack_28.len = 0x17147d;
    run_test_tcp_shutdown_after_write_cold_4();
LAB_0017147d:
    puVar2 = (uv_loop_t *)puVar5;
    uStack_28.len = 0x171482;
    run_test_tcp_shutdown_after_write_cold_5();
LAB_00171482:
    uStack_28.len = 0x171487;
    run_test_tcp_shutdown_after_write_cold_6();
LAB_00171487:
    uStack_28.len = 0x17148c;
    run_test_tcp_shutdown_after_write_cold_7();
LAB_0017148c:
    uStack_28.len = 0x171491;
    run_test_tcp_shutdown_after_write_cold_8();
LAB_00171491:
    uStack_28.len = 0x171496;
    run_test_tcp_shutdown_after_write_cold_9();
LAB_00171496:
    uStack_28.len = 0x17149b;
    run_test_tcp_shutdown_after_write_cold_10();
  }
  uStack_28.len = 0x1714a0;
  run_test_tcp_shutdown_after_write_cold_11();
LAB_001714a0:
  uStack_28.len = (size_t)timer_cb;
  run_test_tcp_shutdown_after_write_cold_12();
  uv_close((uv_handle_t *)puVar2,close_cb);
  uStack_28 = uv_buf_init("TEST",4);
  puVar7 = &write_req;
  iVar4 = 0x347c28;
  iVar1 = uv_write(&write_req,(uv_stream_t *)&conn,&uStack_28,1,write_cb);
  if (iVar1 == 0) {
    puVar8 = &shutdown_req;
    iVar4 = 0x347c28;
    iVar1 = uv_shutdown(&shutdown_req,(uv_stream_t *)&conn,shutdown_cb);
    puVar9 = (uv_tcp_t *)puVar8;
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    timer_cb_cold_1();
    puVar9 = (uv_tcp_t *)puVar7;
  }
  timer_cb_cold_2();
  if (iVar4 == 0) {
    connect_cb_called = connect_cb_called + 1;
    puVar9 = &conn;
    iVar4 = 0x1715bf;
    iVar1 = uv_read_start((uv_stream_t *)&conn,alloc_cb,read_cb);
    if (iVar1 == 0) {
      return extraout_EAX;
    }
  }
  else {
    connect_cb_cold_1();
  }
  connect_cb_cold_2();
  if (puVar9 == &conn) {
    piVar3 = &conn_close_cb_called;
  }
  else {
    if (puVar9 != (uv_tcp_t *)&timer) {
      close_cb_cold_1();
      if (iVar4 == 0) {
        write_cb_called = write_cb_called + 1;
        return extraout_EAX_00;
      }
      write_cb_cold_1();
      if (iVar4 == 0) {
        shutdown_cb_called = shutdown_cb_called + 1;
        uv_close((uv_handle_t *)&conn,close_cb);
        return extraout_EAX_01;
      }
      shutdown_cb_cold_1();
      *extraout_RDX = alloc_cb::slab;
      extraout_RDX[1] = 0x40;
      return 0x347eb0;
    }
    piVar3 = &timer_close_cb_called;
  }
  *piVar3 = *piVar3 + 1;
  return (int)piVar3;
}

Assistant:

TEST_IMPL(tcp_shutdown_after_write) {
  struct sockaddr_in addr;
  uv_loop_t* loop;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  loop = uv_default_loop();

  r = uv_timer_init(loop, &timer);
  ASSERT(r == 0);

  r = uv_timer_start(&timer, timer_cb, 125, 0);
  ASSERT(r == 0);

  r = uv_tcp_init(loop, &conn);
  ASSERT(r == 0);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT(r == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(connect_cb_called == 1);
  ASSERT(write_cb_called == 1);
  ASSERT(shutdown_cb_called == 1);
  ASSERT(conn_close_cb_called == 1);
  ASSERT(timer_close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}